

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_b12_sx_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint32_t in_stack_0000006c;
  uint32_t in_stack_0000007c;
  undefined4 in_stack_00000084;
  uint32_t in_stack_0000008c;
  uint16_t *in_stack_00000090;
  uint8_t *in_stack_00000190;
  uint32_t in_stack_00000198;
  int in_stack_000001a0;
  int in_stack_000001a8;
  blend_unit_fn in_stack_000001b0;
  
  blend_a64_mask_bn_sx_sy_w8n_sse4_1
            (in_stack_00000090,in_stack_0000008c,(uint16_t *)CONCAT44(in_stack_00000084,w),
             in_stack_0000007c,(uint16_t *)mask,in_stack_0000006c,in_stack_00000190,
             in_stack_00000198,in_stack_000001a0,in_stack_000001a8,in_stack_000001b0);
  return;
}

Assistant:

static void blend_a64_mask_b12_sx_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_sx_sy_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                     src1_stride, mask, mask_stride, w, h,
                                     blend_8_b12);
}